

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChLineNurbs::SetupData
          (ChLineNurbs *this,int morder,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *mpoints,
          ChVectorDynamic<> *mknots,ChVectorDynamic<> *weights)

{
  int iVar1;
  ulong uVar2;
  ChException *pCVar3;
  Scalar local_b0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (morder < 1) {
    pCVar3 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_48,"ChLineNurbs::SetupData requires order >= 1.",
               (allocator *)&local_b0);
    ChException::ChException(pCVar3,&local_48);
    __cxa_throw(pCVar3,&ChException::typeinfo,ChException::~ChException);
  }
  uVar2 = ((long)(mpoints->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(mpoints->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar2 < morder + 1) {
    pCVar3 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_68,
               "ChLineNurbs::SetupData requires at least order+1 control points.",
               (allocator *)&local_b0);
    ChException::ChException(pCVar3,&local_68);
    __cxa_throw(pCVar3,&ChException::typeinfo,ChException::~ChException);
  }
  if ((mknots != (ChVectorDynamic<> *)0x0) &&
     ((mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (morder + 1) + uVar2)) {
    pCVar3 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_88,"ChLineNurbs::SetupData: knots must have size=n_points+order+1",
               (allocator *)&local_b0);
    ChException::ChException(pCVar3,&local_88);
    __cxa_throw(pCVar3,&ChException::typeinfo,ChException::~ChException);
  }
  if ((weights != (ChVectorDynamic<> *)0x0) &&
     ((weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar2)) {
    pCVar3 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_a8,"ChLineNurbs::SetupData: weights must have size=n_points",
               (allocator *)&local_b0);
    ChException::ChException(pCVar3,&local_a8);
    __cxa_throw(pCVar3,&ChException::typeinfo,ChException::~ChException);
  }
  this->p = morder;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&this->points,mpoints);
  iVar1 = (int)(((long)(this->points).
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->points).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  if (mknots == (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)(iVar1 + 1 + this->p));
    ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(&this->knots,this->p,0.0,1.0);
  }
  else {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->knots,mknots);
  }
  if (weights != (ChVectorDynamic<> *)0x0) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->weights,weights);
    return;
  }
  local_b0 = 1.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            (&(this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar1,&local_b0);
  return;
}

Assistant:

void ChLineNurbs::SetupData(
    int morder,                         ///< order p: 1= linear, 2=quadratic, etc.
    std::vector<ChVector<> >& mpoints,  ///< control points, size n. Required: at least n >= p+1
    ChVectorDynamic<>* mknots,          ///< knots, size k. Required k=n+p+1. If not provided, initialized to uniform.
    ChVectorDynamic<>* weights          ///< weights, size w. Required w=n. If not provided, all weights as 1.
) {
    if (morder < 1)
        throw ChException("ChLineNurbs::SetupData requires order >= 1.");

    if (mpoints.size() < morder + 1)
        throw ChException("ChLineNurbs::SetupData requires at least order+1 control points.");

    if (mknots && mknots->size() != (mpoints.size() + morder + 1))
        throw ChException("ChLineNurbs::SetupData: knots must have size=n_points+order+1");

    if (weights && weights->size() != mpoints.size())
        throw ChException("ChLineNurbs::SetupData: weights must have size=n_points");

    this->p = morder;
    this->points = mpoints;
    int n = (int)points.size();

    if (mknots)
        this->knots = *mknots;
    else {
        this->knots.setZero(n + p + 1);
        ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots, p);
    }

    if (weights)
        this->weights = *weights;
    else
        this->weights.setConstant(n, 1.0);
}